

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_traversal_sequencer.h
# Opt level: O1

bool __thiscall
draco::
MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
::GenerateSequenceInternal
          (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
           *this)

{
  DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
  *this_00;
  CornerTable *pCVar1;
  pointer pIVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  CornerIndex corner_id;
  int iVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  
  this_00 = &this->traverser_;
  pCVar1 = (this->traverser_).
           super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           .corner_table_;
  std::
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ::reserve((this->super_PointsSequencer).out_point_ids_,
            (long)(int)((ulong)((long)(pCVar1->vertex_corners_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pCVar1->vertex_corners_).vector_.
                                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2));
  if (this->corner_order_ ==
      (vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
       *)0x0) {
    pCVar1 = (this->traverser_).
             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             .corner_table_;
    iVar6 = (int)((ulong)((long)(pCVar1->corner_to_vertex_map_).vector_.
                                super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pCVar1->corner_to_vertex_map_).vector_.
                                super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 2) / 3);
    bVar9 = 0 < iVar6;
    if (iVar6 < 1) {
      return true;
    }
    iVar7 = 0;
    bVar3 = DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
            ::TraverseFromCorner(this_00,(CornerIndex)0x0);
    if (bVar3) {
      corner_id.value_ = 3;
      do {
        if (iVar6 + -1 == iVar7) {
          return true;
        }
        bVar9 = DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                ::TraverseFromCorner(this_00,corner_id);
        corner_id.value_ = corner_id.value_ + 3;
        iVar7 = iVar7 + 1;
      } while (bVar9);
      bVar9 = iVar7 < iVar6;
    }
  }
  else {
    pIVar2 = (this->corner_order_->
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar9 = (this->corner_order_->
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish != pIVar2;
    if (!bVar9) {
      return true;
    }
    bVar3 = DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
            ::TraverseFromCorner(this_00,(CornerIndex)pIVar2->value_);
    if (bVar3) {
      uVar4 = 1;
      do {
        uVar8 = (ulong)uVar4;
        pIVar2 = (this->corner_order_->
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar5 = (long)(this->corner_order_->
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2 >> 2;
        bVar9 = uVar8 < uVar5;
        if (uVar5 <= uVar8) {
          return true;
        }
        bVar3 = DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                ::TraverseFromCorner(this_00,(CornerIndex)pIVar2[uVar8].value_);
        uVar4 = uVar4 + 1;
      } while (bVar3);
    }
  }
  if (!bVar9) {
    return true;
  }
  return false;
}

Assistant:

bool GenerateSequenceInternal() override {
    // Preallocate memory for storing point indices. We expect the number of
    // points to be the same as the number of corner table vertices.
    out_point_ids()->reserve(traverser_.corner_table()->num_vertices());

    traverser_.OnTraversalStart();
    if (corner_order_) {
      for (uint32_t i = 0; i < corner_order_->size(); ++i) {
        if (!ProcessCorner(corner_order_->at(i))) {
          return false;
        }
      }
    } else {
      const int32_t num_faces = traverser_.corner_table()->num_faces();
      for (int i = 0; i < num_faces; ++i) {
        if (!ProcessCorner(CornerIndex(3 * i))) {
          return false;
        }
      }
    }
    traverser_.OnTraversalEnd();
    return true;
  }